

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,Ea<(moira::Mode)6,_(moira::Size)1> *ea)

{
  if ((ea->ext1 & 0x100) == 0) {
    briefExtension<(moira::Mode)6,(moira::Size)1>(this,ea);
  }
  else {
    fullExtension<(moira::Mode)6,(moira::Size)1>(this,ea);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(const Ea<M,S> &ea)
{
    switch (M) {

        case 0: // Dn
        {
            *this << Dn{ea.reg};
            break;
        }
        case 1: // An
        {
            *this << An{ea.reg};
            break;
        }
        case 2: // (An)
        {
            *this << "(" << An{ea.reg} << ")";
            break;
        }
        case 3:  // (An)+
        {
            *this << "(" << An{ea.reg} << ")+";
            break;
        }
        case 4: // -(An)
        {
            *this << "-(" << An{ea.reg} << ")";
            break;
        }
        case 5: // (d,An)
        {
            *this << "(" << Int{(i16)ea.ext1};
            *this << "," << An{ea.reg} << ")";
            break;
        }
        case 6: // (d,An,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 7: // ABS.W
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".W" : ".w");
            break;
        }
        case 8: // ABS.L
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".L" : ".l");
            break;
        }
        case 9: // (d,PC)
        {
            *this << "(" << Int{(i16)ea.ext1} << ",PC)";
            auto resolved = UInt(ea.pc + (i16)ea.ext1 + 2);
            StrWriter(comment, hex, upper) << "; (" << resolved << ")" << Finish{};
            break;
        }
        case 10: // (d,PC,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 11: // Imm
        {
            *this << Imu(ea.ext1);
            break;
        }
    }
    return *this;
}